

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sizeof_struct.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(short int) : ",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," byte",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(int) : ",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," byte",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(st1) : ",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," byte",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(st2) : ",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," byte",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
    std::cout << "(short int) : " << sizeof(int16_t) << " byte" << std::endl;
    std::cout << "(int) : " << sizeof(int32_t) << " byte" << std::endl;
    std::cout << "(st1) : " << sizeof(st1) << " byte" << std::endl;
    std::cout << "(st2) : " << sizeof(st2) << " byte" << std::endl;

    return 0;
}